

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeConst(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Iterator IVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Literal local_c8;
  uintptr_t local_b0;
  Expression *local_a8;
  uintptr_t *local_a0;
  Type *t;
  Iterator __end3;
  undefined1 local_78 [8];
  Iterator __begin3;
  Type *__range3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType local_38;
  HeapType local_30;
  uintptr_t local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isRef((Type *)&this_local);
  if (bVar1) {
    bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
    if (!bVar1) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd39,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
    }
    bVar1 = Type::isNullable((Type *)&this_local);
    if ((bVar1) && (bVar1 = oneIn(this,8), bVar1)) {
      local_28 = (uintptr_t)Type::getHeapType((Type *)&this_local);
      type_local.id = (uintptr_t)Builder::makeRefNull(&this->builder,(HeapType)local_28);
    }
    else {
      local_30 = Type::getHeapType((Type *)&this_local);
      bVar1 = HeapType::isString(&local_30);
      if (bVar1) {
        type_local.id = (uintptr_t)makeStringConst(this);
      }
      else {
        local_38 = Type::getHeapType((Type *)&this_local);
        bVar1 = HeapType::isBasic(&local_38);
        if (bVar1) {
          type_local.id = (uintptr_t)makeBasicRef(this,(Type)this_local);
        }
        else {
          operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
          type_local.id = (uintptr_t)makeCompoundRef(this,(Type)this_local);
        }
      }
    }
  }
  else {
    bVar1 = Type::isTuple((Type *)&this_local);
    if (bVar1) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)&this_local;
      IVar2 = Type::begin((Type *)__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      local_78 = (undefined1  [8])
                 IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      PVar3 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
      while( true ) {
        __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar3.index;
        t = PVar3.parent;
        bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_78
                           ,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
        if (!bVar1) break;
        local_a0 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_78);
        local_b0 = *local_a0;
        local_a8 = makeConst(this,(Type)local_b0);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3,
                   &local_a8);
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_78);
        PVar3.index = (size_t)__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent;
        PVar3.parent = t;
      }
      type_local.id =
           (uintptr_t)
           Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
    }
    else {
      bVar1 = Type::isBasic((Type *)&this_local);
      if (!bVar1) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xd4d,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
      }
      makeLiteral(&local_c8,this,(Type)this_local);
      type_local.id = (uintptr_t)Builder::makeConst(&this->builder,&local_c8);
      ::wasm::Literal::~Literal(&local_c8);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeConst(Type type) {
  if (type.isRef()) {
    assert(wasm.features.hasReferenceTypes());
    // With a low chance, just emit a null if that is valid.
    if (type.isNullable() && oneIn(8)) {
      return builder.makeRefNull(type.getHeapType());
    }
    if (type.getHeapType().isString()) {
      return makeStringConst();
    }
    if (type.getHeapType().isBasic()) {
      return makeBasicRef(type);
    } else {
      return makeCompoundRef(type);
    }
  } else if (type.isTuple()) {
    std::vector<Expression*> operands;
    for (const auto& t : type) {
      operands.push_back(makeConst(t));
    }
    return builder.makeTupleMake(std::move(operands));
  } else {
    assert(type.isBasic());
    return builder.makeConst(makeLiteral(type));
  }
}